

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrecurse.c
# Opt level: O0

int hugeDtdTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  xmlParserCtxtPtr ctxt_00;
  long lVar2;
  long lVar3;
  long lVar4;
  unsigned_long uVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  bool bVar9;
  unsigned_long total_size;
  unsigned_long f_size;
  unsigned_long e_size;
  unsigned_long c_size;
  unsigned_long b_size;
  unsigned_long a_size;
  unsigned_long allowed_expansion;
  unsigned_long fixed_cost;
  int parserOptions;
  int res;
  xmlDocPtr doc;
  xmlParserCtxtPtr ctxt;
  int options_local;
  char *err_local;
  char *result_local;
  char *filename_local;
  
  fixed_cost._0_4_ = 0x10;
  nb_tests = nb_tests + 1;
  ctxt_00 = (xmlParserCtxtPtr)xmlNewParserCtxt();
  if ((options & 1U) != 0) {
    initSAX(ctxt_00);
  }
  if ((options & 2U) == 0) {
    fixed_cost._0_4_ = 0x12;
  }
  lVar2 = xmlCtxtReadFile(ctxt_00,"test/recurse/huge_dtd.xml",0,(undefined4)fixed_cost);
  if (lVar2 == 0) {
    fprintf(_stderr,"Failed to parse huge_dtd.xml\n");
    fixed_cost._4_4_ = 1;
  }
  else {
    iVar1 = xmlStrlen("<!-- comment -->");
    lVar3 = (long)iVar1;
    bVar9 = ctxt_00->sizeentcopy < 1000000;
    if (bVar9) {
      fprintf(_stderr,"Total entity size too small: %lu\n",ctxt_00->sizeentcopy);
    }
    fixed_cost._4_4_ = (uint)bVar9;
    lVar4 = (lVar3 + 0x17) * 2;
    uVar5 = lVar3 * 0x36a8 + (lVar3 + lVar4 + (lVar4 + 0x17) * 2 + 0x3c) * 0x7ce + 0x1d4b3;
    if (ctxt_00->sizeentcopy != uVar5) {
      fprintf(_stderr,"Wrong total entity size: %lu (expected %lu)\n",ctxt_00->sizeentcopy,uVar5);
      fixed_cost._4_4_ = 1;
    }
    sVar6 = strlen(hugeDocParts->start);
    sVar7 = strlen(hugeDocParts->segment);
    sVar8 = strlen(hugeDocParts->finish);
    uVar5 = sVar6 + sVar7 * 999 + sVar8 + 0x38;
    if (ctxt_00->sizeentities != uVar5) {
      fprintf(_stderr,"Wrong parsed entity size: %lu (expected %lu)\n",ctxt_00->sizeentities,uVar5);
      fixed_cost._4_4_ = 1;
    }
  }
  xmlFreeDoc(lVar2);
  xmlFreeParserCtxt(ctxt_00);
  return fixed_cost._4_4_;
}

Assistant:

static int
hugeDtdTest(const char *filename ATTRIBUTE_UNUSED,
            const char *result ATTRIBUTE_UNUSED,
            const char *err ATTRIBUTE_UNUSED,
            int options) {
    xmlParserCtxtPtr ctxt;
    xmlDocPtr doc;
    int res = 0;
    int parserOptions = XML_PARSE_DTDVALID;

    nb_tests++;

    ctxt = xmlNewParserCtxt();
    if (options & OPT_SAX)
        initSAX(ctxt);
    if ((options & OPT_NO_SUBST) == 0)
        parserOptions |= XML_PARSE_NOENT;
    doc = xmlCtxtReadFile(ctxt, "test/recurse/huge_dtd.xml", NULL,
                          parserOptions);
    if (doc == NULL) {
        fprintf(stderr, "Failed to parse huge_dtd.xml\n");
	res = 1;
    } else {
        unsigned long fixed_cost = 20;
        unsigned long allowed_expansion = 1000000;
        unsigned long a_size = xmlStrlen(BAD_CAST "<!-- comment -->");
        unsigned long b_size;
        unsigned long c_size;
        unsigned long e_size;
        unsigned long f_size;
        unsigned long total_size;

        if (ctxt->sizeentcopy < allowed_expansion) {
            fprintf(stderr, "Total entity size too small: %lu\n",
                    ctxt->sizeentcopy);
            res = 1;
        }

        b_size = (a_size + strlen("&a;") + fixed_cost) * 2;
        c_size = (b_size + strlen("&b;") + fixed_cost) * 2;
        /*
         * Internal parameter entites are substitued eagerly and
         * need different accounting.
         */
        e_size = a_size * 2;
        f_size = e_size * 2;
        total_size = /* internal */
                     e_size + f_size + fixed_cost * 4 +
                     (a_size + e_size + f_size + fixed_cost * 3) *
                     (MAX_NODES - 1) * 2 +
                     /* external */
                     (a_size + b_size + c_size + fixed_cost * 3) *
                     (MAX_NODES - 1) * 2 +
                     /* final reference in main doc */
                     strlen("success") + fixed_cost;
        if (ctxt->sizeentcopy != total_size) {
            fprintf(stderr, "Wrong total entity size: %lu (expected %lu)\n",
                    ctxt->sizeentcopy, total_size);
            res = 1;
        }

        total_size = strlen(hugeDocParts->start) +
                     strlen(hugeDocParts->segment) * (MAX_NODES - 1) +
                     strlen(hugeDocParts->finish) +
                     /*
                      * Other external entities pa.ent, pb.ent, pc.ent.
                      * These are currently counted twice because they're
                      * used both in DTD and EntityValue.
                      */
                     (16 + 6 + 6) * 2;
        if (ctxt->sizeentities != total_size) {
            fprintf(stderr, "Wrong parsed entity size: %lu (expected %lu)\n",
                    ctxt->sizeentities, total_size);
            res = 1;
        }
    }

    xmlFreeDoc(doc);
    xmlFreeParserCtxt(ctxt);

    return(res);
}